

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::ToolBar::setOrientation(ToolBar *this,Orientation orientation)

{
  ToolBarPrivate *pTVar1;
  ToolBarLayout *pTVar2;
  NavigationArrow *pNVar3;
  undefined4 *puVar4;
  QObject local_60 [8];
  QObject local_58 [8];
  code *local_50;
  ImplFn local_48;
  code *local_40;
  undefined8 local_38;
  
  if (((this->d).d)->layout->orient != orientation) {
    QObject::deleteLater();
    QObject::deleteLater();
    pNVar3 = (NavigationArrow *)operator_new(0x30);
    if (orientation == Vertical) {
      NavigationArrow::NavigationArrow(pNVar3,Top,&this->super_QWidget);
      ((this->d).d)->left = pNVar3;
      pNVar3 = (NavigationArrow *)operator_new(0x30);
      NavigationArrow::NavigationArrow(pNVar3,Bottom,&this->super_QWidget);
    }
    else {
      NavigationArrow::NavigationArrow(pNVar3,Left,&this->super_QWidget);
      ((this->d).d)->left = pNVar3;
      pNVar3 = (NavigationArrow *)operator_new(0x30);
      NavigationArrow::NavigationArrow(pNVar3,Right,&this->super_QWidget);
    }
    ((this->d).d)->right = pNVar3;
    QWidget::setSizePolicy((QSizePolicy)SUB84(this,0));
    pTVar1 = (this->d).d;
    ToolBarLayout::setLeftArrow(pTVar1->layout,pTVar1->left);
    pTVar1 = (this->d).d;
    ToolBarLayout::setRightArrow(pTVar1->layout,pTVar1->right);
    pNVar3 = ((this->d).d)->left;
    local_40 = NavigationArrow::clicked;
    local_38 = 0;
    local_50 = _q_leftArrowClicked;
    local_48 = (ImplFn)0x0;
    puVar4 = (undefined4 *)operator_new(0x20);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::QSlotObject<void_(QtMWidgets::ToolBar::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar4 + 4) = _q_leftArrowClicked;
    *(undefined8 *)(puVar4 + 6) = 0;
    QObject::connectImpl
              (local_58,(void **)pNVar3,(QObject *)&local_40,(void **)this,
               (QSlotObjectBase *)&local_50,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_58);
    pNVar3 = ((this->d).d)->right;
    local_40 = NavigationArrow::clicked;
    local_38 = 0;
    local_50 = _q_rightArrowClicked;
    local_48 = (ImplFn)0x0;
    puVar4 = (undefined4 *)operator_new(0x20);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::QSlotObject<void_(QtMWidgets::ToolBar::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar4 + 4) = _q_rightArrowClicked;
    *(undefined8 *)(puVar4 + 6) = 0;
    QObject::connectImpl
              (local_60,(void **)pNVar3,(QObject *)&local_40,(void **)this,
               (QSlotObjectBase *)&local_50,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    pTVar2 = ((this->d).d)->layout;
    if (pTVar2->orient != orientation) {
      pTVar2->orient = orientation;
      QLayout::update();
    }
    QWidget::updateGeometry();
    orientationChanged(this,orientation);
  }
  return;
}

Assistant:

void
ToolButton::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		if( d->leftButtonPressed )
		{
			d->leftButtonPressed = false;
			d->action->trigger();
		}

		e->accept();
	}
	else
		e->ignore();
}